

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int update_timer(Curl_multi *multi)

{
  CURLMcode CVar1;
  uint local_2c;
  uint local_28;
  uint local_24;
  long local_20;
  long timeout_ms;
  Curl_multi *multi_local;
  
  if (multi->timer_cb == (curl_multi_timer_callback)0x0) {
    multi_local._4_4_ = 0;
  }
  else {
    timeout_ms = (long)multi;
    CVar1 = multi_timeout(multi,&local_20);
    if (CVar1 == CURLM_OK) {
      if (local_20 < 0) {
        if ((((*(long *)(timeout_ms + 0x170) < 1) && (-1 < *(long *)(timeout_ms + 0x170))) &&
            (*(long *)(timeout_ms + 0x178) < 1)) && (-1 < *(long *)(timeout_ms + 0x178))) {
          multi_local._4_4_ = 0;
        }
        else {
          *(__time_t *)(timeout_ms + 0x170) = 0;
          *(__suseconds_t *)(timeout_ms + 0x178) = 0;
          multi_local._4_4_ =
               (**(code **)(timeout_ms + 0x160))
                         (timeout_ms,0xffffffffffffffff,*(undefined8 *)(timeout_ms + 0x168));
        }
      }
      else {
        if (*(long *)(*(long *)(timeout_ms + 0x80) + 0x18) < *(long *)(timeout_ms + 0x170)) {
          local_24 = 0xffffffff;
        }
        else {
          if (*(long *)(timeout_ms + 0x170) < *(long *)(*(long *)(timeout_ms + 0x80) + 0x18)) {
            local_28 = 1;
          }
          else {
            if (*(long *)(*(long *)(timeout_ms + 0x80) + 0x20) < *(long *)(timeout_ms + 0x178)) {
              local_2c = 0xffffffff;
            }
            else {
              local_2c = (uint)(*(long *)(timeout_ms + 0x178) <
                               *(long *)(*(long *)(timeout_ms + 0x80) + 0x20));
            }
            local_28 = local_2c;
          }
          local_24 = local_28;
        }
        if (local_24 == 0) {
          multi_local._4_4_ = 0;
        }
        else {
          *(undefined8 *)(timeout_ms + 0x170) = *(undefined8 *)(*(long *)(timeout_ms + 0x80) + 0x18)
          ;
          *(undefined8 *)(timeout_ms + 0x178) = *(undefined8 *)(*(long *)(timeout_ms + 0x80) + 0x20)
          ;
          multi_local._4_4_ =
               (**(code **)(timeout_ms + 0x160))
                         (timeout_ms,local_20,*(undefined8 *)(timeout_ms + 0x168));
        }
      }
    }
    else {
      multi_local._4_4_ = -1;
    }
  }
  return multi_local._4_4_;
}

Assistant:

static int update_timer(struct Curl_multi *multi)
{
  long timeout_ms;

  if(!multi->timer_cb)
    return 0;
  if(multi_timeout(multi, &timeout_ms)) {
    return -1;
  }
  if(timeout_ms < 0) {
    static const struct timeval none={0, 0};
    if(Curl_splaycomparekeys(none, multi->timer_lastcall)) {
      multi->timer_lastcall = none;
      /* there's no timeout now but there was one previously, tell the app to
         disable it */
      return multi->timer_cb((CURLM*)multi, -1, multi->timer_userp);
    }
    return 0;
  }

  /* When multi_timeout() is done, multi->timetree points to the node with the
   * timeout we got the (relative) time-out time for. We can thus easily check
   * if this is the same (fixed) time as we got in a previous call and then
   * avoid calling the callback again. */
  if(Curl_splaycomparekeys(multi->timetree->key, multi->timer_lastcall) == 0)
    return 0;

  multi->timer_lastcall = multi->timetree->key;

  return multi->timer_cb((CURLM*)multi, timeout_ms, multi->timer_userp);
}